

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpf_dump.c
# Opt level: O1

void bpf_dump(bpf_program *p,int option)

{
  uint uVar1;
  char *__s;
  uint n;
  long lVar2;
  bpf_insn *p_00;
  
  uVar1 = p->bf_len;
  p_00 = p->bf_insns;
  if (option < 3) {
    if (option == 2) {
      if (0 < (int)uVar1) {
        lVar2 = 0;
        do {
          printf("{ 0x%x, %d, %d, 0x%08x },\n",(ulong)p_00[lVar2].code,(ulong)p_00[lVar2].jt,
                 (ulong)p_00[lVar2].jf,(ulong)p_00[lVar2].k);
          lVar2 = lVar2 + 1;
        } while (uVar1 != (uint)lVar2);
      }
    }
    else if (0 < (int)uVar1) {
      n = 0;
      do {
        __s = bpf_image(p_00,n);
        puts(__s);
        p_00 = p_00 + 1;
        n = n + 1;
      } while (uVar1 != n);
    }
  }
  else {
    printf("%d\n",(ulong)uVar1);
    if (0 < (int)uVar1) {
      lVar2 = 0;
      do {
        printf("%u %u %u %u\n",(ulong)p_00[lVar2].code,(ulong)p_00[lVar2].jt,(ulong)p_00[lVar2].jf,
               (ulong)p_00[lVar2].k);
        lVar2 = lVar2 + 1;
      } while (uVar1 != (uint)lVar2);
    }
  }
  return;
}

Assistant:

void
bpf_dump(const struct bpf_program *p, int option)
{
	const struct bpf_insn *insn;
	int i;
	int n = p->bf_len;

	insn = p->bf_insns;
	if (option > 2) {
		printf("%d\n", n);
		for (i = 0; i < n; ++insn, ++i) {
			printf("%u %u %u %u\n", insn->code,
			       insn->jt, insn->jf, insn->k);
		}
		return ;
	}
	if (option > 1) {
		for (i = 0; i < n; ++insn, ++i)
			printf("{ 0x%x, %d, %d, 0x%08x },\n",
			       insn->code, insn->jt, insn->jf, insn->k);
		return;
	}
	for (i = 0; i < n; ++insn, ++i) {
#ifdef BDEBUG
		extern int bids[];
		if (bids[i] > 0)
			printf("[%02d]", bids[i] - 1);
		else
			printf(" -- ");
#endif
		puts(bpf_image(insn, i));
	}
}